

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)60,(moira::Mode)8,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char cVar9;
  Ea<(moira::Mode)8,_(moira::Size)4> dst;
  Ea<(moira::Mode)8,_(moira::Size)4> local_44;
  
  *addr = *addr + 2;
  iVar4 = (*this->_vptr_Moira[5])();
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])(this);
  local_44.reg = op & 7;
  local_44.pc = *addr;
  *addr = local_44.pc + 2;
  iVar6 = (*this->_vptr_Moira[5])(this);
  *addr = *addr + 2;
  uVar7 = (*this->_vptr_Moira[5])(this);
  local_44.ext1 = uVar7 & 0xffff | iVar6 << 0x10;
  bVar3 = str->upper;
  pcVar8 = "eori";
  if ((bool)bVar3 != false) {
    pcVar8 = "EORI";
  }
  cVar9 = *pcVar8;
  if (cVar9 != '\0') {
    do {
      pcVar8 = pcVar8 + 1;
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = cVar9;
      cVar9 = *pcVar8;
    } while (cVar9 != '\0');
    bVar3 = str->upper;
  }
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = '.';
  pbVar2 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = (~bVar3 & 1) << 5 | 0x4c;
  iVar6 = (this->tab).raw;
  while (pcVar8 = str->ptr, pcVar8 < str->base + iVar6) {
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  str->ptr = pcVar8 + 1;
  *pcVar8 = '#';
  StrWriter::operator<<(str,(UInt)(iVar4 << 0x10 | uVar5 & 0xffff));
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = ',';
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = ' ';
  StrWriter::operator<<(str,&local_44);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}